

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_StateData.cpp
# Opt level: O2

void __thiscall
amrex::StateData::FillBoundary
          (StateData *this,FArrayBox *dest,Real time,Real *dx,RealBox *prob_domain,int dest_comp,
          int src_comp,int num_comp)

{
  Box *this_00;
  Box *b;
  IntVect *pIVar1;
  StateDescriptor *this_01;
  bool bVar2;
  int k;
  long lVar3;
  double *pdVar4;
  BCRec *pBVar5;
  BndryFunc *pBVar6;
  undefined4 uVar7;
  int iVar8;
  int *bxlo;
  int *dlo;
  undefined4 uVar9;
  int iVar10;
  int *bxhi;
  IntVect *pIVar11;
  pointer piVar12;
  int *dhi;
  int i;
  int iVar13;
  Real time_local;
  int local_a0;
  int local_9c;
  BCRec bcr;
  long local_80;
  Vector<int,_std::allocator<int>_> bcrs;
  Real xlo [3];
  
  this_00 = &this->domain;
  b = &(dest->super_BaseFab<double>).domain;
  time_local = time;
  bVar2 = Box::contains(this_00,b);
  if (bVar2) {
    return;
  }
  pIVar11 = &(dest->super_BaseFab<double>).domain.bigend;
  bcrs.super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  bcrs.super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  bcrs.super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bcr.bc[0] = -0x29a;
  bcr.bc[1] = -0x29a;
  bcr.bc[2] = -0x29a;
  bcr.bc[3] = -0x29a;
  bcr.bc[4] = -0x29a;
  bcr.bc[5] = -0x29a;
  for (lVar3 = 0; lVar3 != 0xc; lVar3 = lVar3 + 4) {
    *(double *)((long)xlo + lVar3 * 2) =
         (double)(*(int *)((long)(b->smallend).vect + lVar3) -
                 *(int *)((long)(this_00->smallend).vect + lVar3)) *
         *(double *)((long)dx + lVar3 * 2) + *(double *)((long)prob_domain->xlo + lVar3 * 2);
  }
  pIVar1 = &(this->domain).bigend;
  iVar13 = 0;
  do {
    while( true ) {
      if (num_comp <= iVar13) {
        std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                  ((_Vector_base<int,_std::allocator<int>_> *)&bcrs);
        return;
      }
      i = src_comp + iVar13;
      pdVar4 = BaseFab<double>::dataPtr(&dest->super_BaseFab<double>,dest_comp + iVar13);
      this_01 = this->desc;
      if ((this_01->m_primary).super_vector<int,_std::allocator<int>_>.
          super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start[i]
          != 0) break;
      pBVar5 = StateDescriptor::getBC(this_01,i);
      for (lVar3 = 0; lVar3 != 0xc; lVar3 = lVar3 + 4) {
        uVar7 = 0;
        uVar9 = 0;
        if (*(int *)((long)(b->smallend).vect + lVar3) <=
            *(int *)((long)(this_00->smallend).vect + lVar3)) {
          uVar9 = *(undefined4 *)((long)pBVar5->bc + lVar3);
        }
        *(undefined4 *)((long)bcr.bc + lVar3) = uVar9;
        if (*(int *)((long)(this->domain).bigend.vect + lVar3) <=
            *(int *)((long)(dest->super_BaseFab<double>).domain.bigend.vect + lVar3)) {
          uVar7 = *(undefined4 *)((long)pBVar5->bc + lVar3 + 0xc);
        }
        *(undefined4 *)((long)bcr.bc + lVar3 + 0xc) = uVar7;
      }
      pBVar6 = StateDescriptor::bndryFill(this->desc,i);
      (*pBVar6->_vptr_BndryFunc[3])(pBVar6,pdVar4,b,pIVar11,this_00,pIVar1,dx,xlo,&time_local,&bcr);
LAB_0057af38:
      iVar13 = iVar13 + 1;
    }
    iVar10 = (this_01->m_groupsize).super_vector<int,_std::allocator<int>_>.
             super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
             [i];
    if (num_comp < iVar10 + iVar13) {
      pBVar5 = StateDescriptor::getBC(this_01,i);
      for (lVar3 = 0; lVar3 != 0xc; lVar3 = lVar3 + 4) {
        uVar7 = 0;
        uVar9 = 0;
        if (*(int *)((long)(b->smallend).vect + lVar3) <=
            *(int *)((long)(this_00->smallend).vect + lVar3)) {
          uVar9 = *(undefined4 *)((long)pBVar5->bc + lVar3);
        }
        *(undefined4 *)((long)bcr.bc + lVar3) = uVar9;
        if (*(int *)((long)(this->domain).bigend.vect + lVar3) <=
            *(int *)((long)(dest->super_BaseFab<double>).domain.bigend.vect + lVar3)) {
          uVar7 = *(undefined4 *)((long)pBVar5->bc + lVar3 + 0xc);
        }
        *(undefined4 *)((long)bcr.bc + lVar3 + 0xc) = uVar7;
      }
      pBVar6 = StateDescriptor::bndryFill(this->desc,i);
      (*pBVar6->_vptr_BndryFunc[3])(pBVar6,pdVar4,b,pIVar11,this_00,pIVar1,dx,xlo,&time_local,&bcr);
      goto LAB_0057af38;
    }
    local_a0 = iVar10 + iVar13;
    local_80 = (long)iVar10;
    std::vector<int,_std::allocator<int>_>::resize
              (&bcrs.super_vector<int,_std::allocator<int>_>,(long)iVar10 * 6);
    iVar13 = 0;
    piVar12 = bcrs.super_vector<int,_std::allocator<int>_>.
              super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
    ;
    local_9c = 0;
    if (0 < (int)local_80) {
      local_9c = (int)local_80;
    }
    for (; iVar13 != local_9c; iVar13 = iVar13 + 1) {
      pBVar5 = StateDescriptor::getBC(this->desc,i + iVar13);
      for (lVar3 = -3; lVar3 != 0; lVar3 = lVar3 + 1) {
        iVar8 = 0;
        iVar10 = 0;
        if (pIVar11->vect[lVar3] <= pIVar1->vect[lVar3]) {
          iVar10 = pBVar5->bc[lVar3 + 3];
        }
        bcr.bc[lVar3 + 3] = iVar10;
        if ((int)((IndexType *)(&(this->domain).bigend + 1))[lVar3].itype <=
            (int)((IndexType *)(&(dest->super_BaseFab<double>).domain.bigend + 1))[lVar3].itype) {
          iVar8 = pBVar5[1].bc[lVar3];
        }
        *(int *)((long)&local_80 + lVar3 * 4) = iVar8;
      }
      for (lVar3 = 0; lVar3 != 6; lVar3 = lVar3 + 1) {
        piVar12[lVar3] = bcr.bc[lVar3];
      }
      piVar12 = piVar12 + 6;
    }
    pBVar6 = StateDescriptor::bndryFill(this->desc,i);
    (*pBVar6->_vptr_BndryFunc[4])
              (pBVar6,pdVar4,b,pIVar11,this_00,pIVar1,dx,xlo,&time_local,
               bcrs.super_vector<int,_std::allocator<int>_>.
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start,local_80);
    iVar13 = local_a0;
  } while( true );
}

Assistant:

void
StateData::FillBoundary (FArrayBox&     dest,
                         Real           time,
                         const Real*    dx,
                         const RealBox& prob_domain,
                         int            dest_comp,
                         int            src_comp,
                         int            num_comp)
{
    BL_PROFILE("StateData::FillBoundary(dx)");
    BL_ASSERT(dest.box().ixType() == desc->getType());

    if (domain.contains(dest.box())) return;

    const Box& bx  = dest.box();
    const int* dlo = dest.loVect();
    const int* dhi = dest.hiVect();
    const int* plo = domain.loVect();
    const int* phi = domain.hiVect();

    Vector<int> bcrs;

    Real xlo[AMREX_SPACEDIM];
    BCRec bcr;
    const Real* problo = prob_domain.lo();

    for (int i = 0; i < AMREX_SPACEDIM; i++)
    {
        xlo[i] = problo[i] + dx[i]*(dlo[i]-plo[i]);
    }
    for (int i = 0; i < num_comp; )
    {
        const int dc  = dest_comp+i;
        const int sc  = src_comp+i;
        Real*     dat = dest.dataPtr(dc);

        if (desc->primary(sc))
        {
            const int groupsize = desc->groupsize(sc);

            BL_ASSERT(groupsize != 0);

            if (groupsize+i <= num_comp)
            {
                //
                // Can do the whole group at once.
                //
                bcrs.resize(2*AMREX_SPACEDIM*groupsize);

                int* bci  = bcrs.dataPtr();

                for (int j = 0; j < groupsize; j++)
                {
                    amrex::setBC(bx,domain,desc->getBC(sc+j),bcr);

                    const int* bc = bcr.vect();

                    for (int k = 0; k < 2*AMREX_SPACEDIM; k++)
                        bci[k] = bc[k];

                    bci += 2*AMREX_SPACEDIM;
                }
                //
                // Use the "group" boundary fill routine.
                //
                desc->bndryFill(sc)(dat,dlo,dhi,plo,phi,dx,xlo,&time,bcrs.dataPtr(),groupsize);
                i += groupsize;
            }
            else
            {
                amrex::setBC(bx,domain,desc->getBC(sc),bcr);
                desc->bndryFill(sc)(dat,dlo,dhi,plo,phi,dx,xlo,&time,bcr.vect());
                i++;
            }
        }
        else
        {
            amrex::setBC(bx,domain,desc->getBC(sc),bcr);
            desc->bndryFill(sc)(dat,dlo,dhi,plo,phi,dx,xlo,&time,bcr.vect());
            i++;
        }
    }

#ifdef AMREX_USE_GPU
    // Add a streamSynchronize here in case the user code launched kernels
    // to handle the boundary fills.
    Gpu::streamSynchronize();
#endif
}